

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Mix_2in_1out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  if (toMix != 0) {
    fVar1 = *coefficients;
    fVar2 = coefficients[1];
    lVar3 = 0;
    do {
      dst[lVar3] = src[lVar3 * 2] * fVar1 + src[lVar3 * 2 + 1] * fVar2 + dst[lVar3];
      lVar3 = lVar3 + 1;
    } while (toMix != (uint32_t)lVar3);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_1out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 1)
	{
		/* Base source data, combined with the coefficients */
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
	}
}